

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency_transform.cc
# Opt level: O3

bool __thiscall
sptk::FrequencyTransform::Run
          (FrequencyTransform *this,vector<double,_std::allocator<double>_> *minimum_phase_sequence,
          vector<double,_std::allocator<double>_> *warped_sequence,Buffer *buffer)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  double *__s;
  double *pdVar4;
  bool bVar5;
  bool bVar6;
  size_t __n;
  long lVar7;
  pointer __dest;
  ulong uVar8;
  size_type __new_size;
  double dVar9;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar6 = false;
  if ((buffer != (Buffer *)0x0) &&
     (bVar6 = false, warped_sequence != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar2 = this->num_input_order_;
    lVar7 = (long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    bVar6 = false;
    if (lVar7 == (long)iVar2 + 1) {
      __new_size = (long)this->num_output_order_ + 1;
      if ((long)(warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(warped_sequence,__new_size);
      }
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
      }
      dVar9 = this->alpha_;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        __s = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
        pdVar4 = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__s != pdVar4) {
          memset(__s,0,((long)pdVar4 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
          dVar9 = this->alpha_;
        }
        bVar6 = true;
        if (-1 < (long)this->num_input_order_) {
          pdVar3 = (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar4 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = this->num_output_order_;
          lVar7 = (long)this->num_input_order_;
          do {
            dVar1 = *__s;
            *pdVar4 = dVar1;
            *__s = dVar1 * this->alpha_ + pdVar3[lVar7];
            if (0 < iVar2) {
              dVar1 = __s[1];
              pdVar4[1] = dVar1;
              __s[1] = *pdVar4 * (1.0 - dVar9 * dVar9) + dVar1 * this->alpha_;
              if (1 < iVar2) {
                uVar8 = 2;
                do {
                  dVar1 = __s[uVar8];
                  pdVar4[uVar8] = dVar1;
                  __s[uVar8] = (dVar1 - __s[uVar8 - 1]) * this->alpha_ + pdVar4[uVar8 - 1];
                  uVar8 = uVar8 + 1;
                } while (iVar2 + 1 != uVar8);
              }
            }
            bVar5 = 0 < lVar7;
            lVar7 = lVar7 + -1;
          } while (bVar5);
        }
      }
      else {
        if (this->num_input_order_ < this->num_output_order_) {
          pdVar3 = (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          __dest = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __n = (long)(minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
          if (__n != 0) {
            memmove(__dest,pdVar3,__n);
            __dest = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pdVar3 = (warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (__dest + lVar7 == pdVar3) {
            return true;
          }
          memset(__dest + lVar7,0,
                 ((long)pdVar3 + (-0x10 - (long)(__dest + iVar2)) & 0xfffffffffffffff8U) + 8);
        }
        else {
          if ((int)__new_size == 0) {
            return true;
          }
          memmove((warped_sequence->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,
                  (minimum_phase_sequence->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start,__new_size * 8);
        }
        bVar6 = true;
      }
    }
  }
  return bVar6;
}

Assistant:

bool FrequencyTransform::Run(const std::vector<double>& minimum_phase_sequence,
                             std::vector<double>* warped_sequence,
                             FrequencyTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ ||
      minimum_phase_sequence.size() != static_cast<std::size_t>(input_length) ||
      NULL == warped_sequence || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (warped_sequence->size() != static_cast<std::size_t>(output_length)) {
    warped_sequence->resize(output_length);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(output_length)) {
    buffer->d_.resize(output_length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    if (num_input_order_ < num_output_order_) {
      std::copy(minimum_phase_sequence.begin(), minimum_phase_sequence.end(),
                warped_sequence->begin());
      std::fill(warped_sequence->begin() + input_length, warped_sequence->end(),
                0.0);
    } else {
      std::copy(minimum_phase_sequence.begin(),
                minimum_phase_sequence.begin() + output_length,
                warped_sequence->begin());
    }
    return true;
  }

  std::fill(warped_sequence->begin(), warped_sequence->end(), 0.0);

  const double beta(1.0 - alpha_ * alpha_);
  const double* c(&(minimum_phase_sequence[0]));
  double* d(&buffer->d_[0]);
  double* g(&((*warped_sequence)[0]));

  // Apply recursive formula.
  for (int i(num_input_order_); 0 <= i; --i) {
    d[0] = g[0];
    g[0] = c[i] + alpha_ * d[0];
    if (1 <= num_output_order_) {
      d[1] = g[1];
      g[1] = beta * d[0] + alpha_ * d[1];
    }
    for (int m(2); m <= num_output_order_; ++m) {
      d[m] = g[m];
      g[m] = d[m - 1] + alpha_ * (d[m] - g[m - 1]);
    }
  }

  return true;
}